

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instantiation.cpp
# Opt level: O3

void __thiscall Inferences::Instantiation::registerClause(Instantiation *this,Clause *cl)

{
  Term *val;
  bool bVar1;
  int iVar2;
  size_t i;
  Literal **ppLVar3;
  TermList TVar4;
  Entry *pEVar5;
  Entry *pEVar6;
  Set<Kernel::Term_*,_Lib::DefaultHash> *this_00;
  Stack<Kernel::Term_*> *val_00;
  long lVar7;
  Term **ppTVar8;
  Term *pTVar9;
  uint uVar10;
  TermList *result;
  uint uVar11;
  void **head;
  bool dummy;
  TermList sort;
  bool local_a9;
  TermList local_a8;
  Term *local_a0;
  uint local_94;
  _func_int **local_90;
  DHMap<Kernel::TermList,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *local_88;
  Instantiation *local_80;
  DHMap<Kernel::TermList,_Lib::Stack<Kernel::Term_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *local_78;
  FixedSizeAllocator<32UL> *local_70;
  FixedSizeAllocator<48UL> *local_68;
  Literal **local_60;
  SubtermIterator local_58;
  
  local_94 = *(uint *)&cl->field_0x38 & 0xfffff;
  if (local_94 != 0) {
    ppLVar3 = cl->_literals;
    local_78 = &this->sorted_candidates;
    local_88 = &this->sorted_candidates_check;
    local_68 = (FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60);
    local_70 = (FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48);
    local_90 = (_func_int **)&PTR__SubtermIterator_00b3d8d0;
    local_80 = this;
    local_60 = ppLVar3;
    uVar11 = 1;
    do {
      Kernel::SubtermIterator::SubtermIterator(&local_58,&(*ppLVar3)->super_Term);
      while( true ) {
        bVar1 = Kernel::SubtermIterator::hasNext(&local_58);
        if (!bVar1) break;
        local_58._used = true;
        val = (Term *)**(undefined8 **)
                        (*(long *)((long)local_58._stack._self._M_t.
                                         super___uniq_ptr_impl<Lib::Stack<const_Kernel::TermList_*>,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                                         .
                                         super__Head_base<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_false>
                                         ._M_head_impl + 0x10) + -8);
        if (((ulong)val & 3) == 0) {
          pTVar9 = val;
          if (*(int *)&val->field_0xc < 0) {
            iVar2 = 0;
            do {
              pTVar9 = *(Term **)&(pTVar9->field_9)._vars;
              if (((ulong)pTVar9 & 1) != 0) {
                uVar10 = 3;
                goto LAB_004eeacc;
              }
              iVar2 = iVar2 + 2;
            } while (*(int *)&pTVar9->field_0xc < 0);
          }
          else {
            iVar2 = 0;
          }
          uVar10 = (pTVar9->field_9)._vars;
LAB_004eeacc:
          if (iVar2 + uVar10 == 0) {
            local_a8._content = 2;
            bVar1 = Kernel::SortHelper::tryGetResultSort
                              ((SortHelper *)val,(TermList)&local_a8,result);
            if (bVar1) {
              TVar4 = Kernel::AtomicSort::defaultSort();
              if (local_a8._content != TVar4._content) {
                if ((local_80->sorted_candidates)._size == 0) {
LAB_004eeb38:
                  this_00 = (Set<Kernel::Term_*,_Lib::DefaultHash> *)
                            Lib::FixedSizeAllocator<48UL>::alloc(local_68);
                  this_00->_capacity = 0;
                  this_00->_nonemptyCells = 0;
                  this_00->_size = 0;
                  this_00->_entries = (Cell *)0x0;
                  Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::expand(this_00);
                  val_00 = (Stack<Kernel::Term_*> *)Lib::FixedSizeAllocator<32UL>::alloc(local_70);
                  val_00->_cursor = (Term **)0x0;
                  val_00->_end = (Term **)0x0;
                  val_00->_capacity = 0;
                  val_00->_stack = (Term **)0x0;
                  Lib::
                  DHMap<Kernel::TermList,_Lib::Stack<Kernel::Term_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                  ::insert(local_78,local_a8,val_00);
                  Lib::
                  DHMap<Kernel::TermList,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                  ::insert(local_88,local_a8,this_00);
                }
                else {
                  pEVar5 = Lib::
                           DHMap<Kernel::TermList,_Lib::Stack<Kernel::Term_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                           ::findEntry(local_78,&local_a8);
                  if (pEVar5 == (Entry *)0x0) goto LAB_004eeb38;
                  val_00 = pEVar5->_val;
                  pEVar6 = Lib::
                           DHMap<Kernel::TermList,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                           ::findEntry(local_88,&local_a8);
                  if (pEVar6 == (Entry *)0x0) {
                    this_00 = (Set<Kernel::Term_*,_Lib::DefaultHash> *)0x0;
                  }
                  else {
                    this_00 = pEVar6->_val;
                  }
                }
                bVar1 = Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::contains(this_00,val);
                if (!bVar1) {
                  local_a0 = val;
                  uVar10 = 0x811c9dc5;
                  lVar7 = 0;
                  do {
                    uVar10 = (*(byte *)((long)&local_a0 + lVar7) ^ uVar10) * 0x1000193;
                    lVar7 = lVar7 + 1;
                  } while (lVar7 != 8);
                  Lib::Set<Kernel::Term*,Lib::DefaultHash>::
                  rawFindOrInsert<Lib::Set<Kernel::Term*,Lib::DefaultHash>::insert(Kernel::Term*,unsigned_int)::_lambda()_1_,Lib::Set<Kernel::Term*,Lib::DefaultHash>::insert(Kernel::Term*,unsigned_int)::_lambda(auto:1)_1_>
                            ((Set<Kernel::Term*,Lib::DefaultHash> *)this_00,
                             (anon_class_8_1_ba1d8281)&local_a0,uVar10,
                             (anon_class_8_1_ba1d8281)&local_a0,&local_a9);
                  ppTVar8 = val_00->_cursor;
                  if (ppTVar8 == val_00->_end) {
                    Lib::Stack<Kernel::Term_*>::expand(val_00);
                    ppTVar8 = val_00->_cursor;
                  }
                  *ppTVar8 = val;
                  val_00->_cursor = val_00->_cursor + 1;
                }
              }
            }
          }
        }
      }
      local_58.super_IteratorCore<Kernel::TermList>._vptr_IteratorCore = local_90;
      Lib::
      Recycled<Lib::Stack<const_Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      ~Recycled(&local_58._stack);
      ppLVar3 = local_60 + (int)uVar11;
      bVar1 = uVar11 < local_94;
      uVar11 = (uVar11 < local_94) + uVar11;
    } while (bVar1);
  }
  return;
}

Assistant:

void Instantiation::registerClause(Clause* cl)
{
  ASS(cl);

  //cout << "register " << cl->toString() << endl;

  for (Literal* lit : cl->iterLits()) {
    SubtermIterator it(lit);
    while(it.hasNext()){
      TermList t = it.next();
      if(t.isTerm() && t.term()->ground()){
        TermList sort;
        if(SortHelper::tryGetResultSort(t,sort)){
          if(sort==AtomicSort::defaultSort()) continue;
          Set<Term*>* cans_check=0;
          Stack<Term*>* cans=0;
          if(sorted_candidates.isEmpty() || !sorted_candidates.find(sort,cans)){
            cans_check = new Set<Term*>();
            cans = new Stack<Term*>();
            sorted_candidates.insert(sort,cans);
            sorted_candidates_check.insert(sort,cans_check);
          }
          else{ ALWAYS(sorted_candidates_check.find(sort,cans_check)); }
          ASS(cans_check && cans);
          // cout << "For sort " << sort << " there are " << cans->size() << " cans" <<endl;
          if(!cans_check->contains(t.term())){
            cans_check->insert(t.term());
            cans->push(t.term());
          }
        }
      }
    }
  }

}